

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

Vertex * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::newObject
          (Pool<btConvexHullInternal::Vertex> *this)

{
  int iVar1;
  PoolArray<btConvexHullInternal::Vertex> *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RSI;
  Vertex *pVVar2;
  
  pVVar2 = this->freeObjects;
  if (pVVar2 == (Vertex *)0x0) {
    this_00 = this->nextArray;
    if (this_00 == (PoolArray<btConvexHullInternal::Vertex> *)0x0) {
      this_00 = (PoolArray<btConvexHullInternal::Vertex> *)btAlignedAllocInternal(0x18,0x10);
      in_RSI = (EVP_PKEY_CTX *)(ulong)(uint)this->arraySize;
      PoolArray<btConvexHullInternal::Vertex>::PoolArray(this_00,this->arraySize);
      this_00->next = this->arrays;
      this->arrays = this_00;
    }
    else {
      this->nextArray = this_00->next;
    }
    iVar1 = PoolArray<btConvexHullInternal::Vertex>::init(this_00,in_RSI);
    pVVar2 = (Vertex *)CONCAT44(extraout_var,iVar1);
  }
  this->freeObjects = pVVar2->next;
  pVVar2->edges = (Edge *)0x0;
  pVVar2->firstNearbyFace = (Face *)0x0;
  pVVar2->next = (Vertex *)0x0;
  pVVar2->prev = (Vertex *)0x0;
  pVVar2->lastNearbyFace = (Face *)0x0;
  pVVar2->copy = -1;
  return pVVar2;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}